

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O1

void __thiscall
trackerboy::apu::Hardware::setMix(Hardware *this,ChannelMix *mix,Mixer *mixer,uint32_t cycletime)

{
  MixMode MVar1;
  float *pfVar2;
  size_t sVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  MixMode MVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  pfVar2 = (mixer->mBuffer)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  sVar3 = mixer->mWriteIndex;
  lVar5 = 0;
  do {
    MVar1 = mix->_M_elems[lVar5];
    MVar8 = (this->mMix)._M_elems[lVar5];
    if (MVar1 != MVar8) {
      MVar8 = MVar8 ^ MVar1;
      fVar11 = 7.5 - (float)(this->mLastOutputs)._M_elems[lVar5];
      fVar10 = 0.0;
      fVar9 = 0.0;
      if (((MVar8 & left) != mute) &&
         (fVar9 = mixer->mVolumeStepLeft * fVar11, (MVar1 & left) != mute)) {
        fVar9 = -fVar9;
      }
      if (((MVar8 & right) != mute) &&
         (fVar10 = fVar11 * mixer->mVolumeStepRight, (MVar1 & right) != mute)) {
        fVar10 = -fVar10;
      }
      fVar11 = mixer->mFactor * (float)cycletime + mixer->mSampleOffset;
      uVar7 = (ulong)fVar11;
      lVar6 = ((long)(fVar11 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7) + sVar3;
      pfVar2[lVar6 * 2] = fVar9 + pfVar2[lVar6 * 2];
      pfVar2[lVar6 * 2 + 1] = fVar10 + pfVar2[lVar6 * 2 + 1];
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  uVar4 = *(undefined8 *)(mix->_M_elems + 2);
  *(undefined8 *)(this->mMix)._M_elems = *(undefined8 *)mix->_M_elems;
  *(undefined8 *)((this->mMix)._M_elems + 2) = uVar4;
  return;
}

Assistant:

void Hardware::setMix(const ChannelMix &mix, Mixer &mixer, uint32_t cycletime) noexcept {

    // check for changes in the mix
    for (size_t i = 0; i < mMix.size(); ++i) {
        auto const next = mix[i];
        auto &last = mMix[i];

        if (next != last) {
            auto changes = +last ^ +next;

            float dcLeft = 0.0f;
            float dcRight = 0.0f;
            auto const level = 7.5f - mLastOutputs[i];
            if (changes & MIX_LEFT) {
                dcLeft = mixer.leftVolume() * level;
                if (modePansLeft(next)) {
                    dcLeft = -dcLeft;
                }
            }

            if (changes & MIX_RIGHT) {
                dcRight = mixer.rightVolume() * level;
                if (modePansRight(next)) {
                    dcRight = -dcRight;
                }
            }

            mixer.mixDc(dcLeft, dcRight, cycletime);
        }
    }


    mMix = mix;
}